

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O0

void tlb_fill(CPUState *cpu,target_ulong_conflict addr,int size,MMUAccessType access_type,
             int mmu_idx,uintptr_t retaddr)

{
  _Bool _Var1;
  _Bool ok;
  CPUClass *cc;
  uintptr_t retaddr_local;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  int size_local;
  target_ulong_conflict addr_local;
  CPUState *cpu_local;
  
  _Var1 = (*cpu->cc->tlb_fill)
                    ((CPUState_conflict *)cpu,(vaddr)addr,size,access_type,mmu_idx,false,retaddr);
  if (_Var1) {
    return;
  }
  __assert_fail("ok",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                ,0x3c7,"void tlb_fill(CPUState *, target_ulong, int, MMUAccessType, int, uintptr_t)"
               );
}

Assistant:

static void tlb_fill(CPUState *cpu, target_ulong addr, int size,
                     MMUAccessType access_type, int mmu_idx, uintptr_t retaddr)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
#ifndef NDEBUG
    bool ok;

    /*
     * This is not a probe, so only valid return is success; failure
     * should result in exception + longjmp to the cpu loop.
     */
    ok = cc->tlb_fill(cpu, addr, size, access_type, mmu_idx, false, retaddr);
    assert(ok);
#else
    cc->tlb_fill(cpu, addr, size, access_type, mmu_idx, false, retaddr);
#endif
}